

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void memory_region_init_ram_x86_64
               (uc_struct_conflict *uc,MemoryRegion *mr,uint64_t size,uint32_t perms)

{
  RAMBlock *pRVar1;
  uint64_t uVar2;
  
  memset(mr,0,0xa0);
  mr->uc = (uc_struct_conflict7 *)uc;
  mr->ops = &unassigned_mem_ops_x86_64;
  mr->enabled = true;
  mr->destructor = memory_region_destructor_none;
  (mr->subregions).tqh_first = (MemoryRegion *)0x0;
  (mr->subregions).tqh_circ.tql_prev = (QTailQLink *)&mr->subregions;
  uVar2 = 0;
  if (size != 0xffffffffffffffff) {
    uVar2 = size;
  }
  *(uint64_t *)&mr->size = uVar2;
  *(ulong *)((long)&mr->size + 8) = (ulong)(size == 0xffffffffffffffff);
  mr->ram = true;
  if ((perms & 2) == 0) {
    mr->readonly = true;
  }
  mr->perms = perms;
  mr->terminates = true;
  mr->destructor = memory_region_destructor_ram;
  pRVar1 = qemu_ram_alloc_x86_64(uc,size,mr);
  mr->ram_block = pRVar1;
  return;
}

Assistant:

void memory_region_init_ram(struct uc_struct *uc,
                            MemoryRegion *mr,
                            uint64_t size,
                            uint32_t perms)
{
    memory_region_init(uc, mr, size);
    mr->ram = true;
    if (!(perms & UC_PROT_WRITE)) {
        mr->readonly = true;
    }
    mr->perms = perms;
    mr->terminates = true;
    mr->destructor = memory_region_destructor_ram;
    mr->ram_block = qemu_ram_alloc(uc, size, mr);
}